

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O1

int space_mixer_mix(mixed_segment *segment)

{
  float fVar1;
  byte bVar2;
  long *plVar3;
  mixed_buffer *pmVar4;
  undefined8 *puVar5;
  void *__s;
  long lVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  float *pfVar10;
  uint uVar11;
  uint32_t size;
  char cVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uStack_70;
  float *pfStack_68;
  long *local_60;
  undefined1 *local_58;
  ulong local_50;
  float local_44;
  float *local_40;
  float *in;
  uint32_t samples;
  
  local_58 = (undefined1 *)&pfStack_68;
  plVar3 = (long *)segment->data;
  in._4_4_ = 0xffffffff;
  bVar2 = *(byte *)((long)plVar3 + 0x542c);
  lVar7 = -(ulong)((uint)bVar2 * 8 + 0xf & 0xfffffff0);
  lVar8 = lVar7 + -0x68;
  local_44 = *(float *)(plVar3 + 0xaa1);
  local_50 = (ulong)bVar2;
  if (bVar2 != 0) {
    uVar15 = 0;
    do {
      pmVar4 = *(mixed_buffer **)(plVar3[2] + uVar15);
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x1442e9;
      mixed_buffer_request_write
                ((float **)((long)&pfStack_68 + uVar15 + lVar8 + 0x68),(uint32_t *)((long)&in + 4),
                 pmVar4);
      uVar15 = uVar15 + 8;
    } while ((uint)bVar2 * 8 != uVar15);
  }
  uVar15 = local_50;
  if ((int)plVar3[1] != 0) {
    uVar16 = 0;
    do {
      puVar5 = *(undefined8 **)(*plVar3 + uVar16 * 8);
      if (puVar5 == (undefined8 *)0x0) {
        cVar12 = '\a';
      }
      else {
        pmVar4 = (mixed_buffer *)*puVar5;
        *(undefined8 *)((long)&uStack_70 + lVar7) = 0x14431e;
        mixed_buffer_request_read(&local_40,(uint32_t *)((long)&in + 4),pmVar4);
        cVar12 = (in._4_4_ == 0) * '\x05';
      }
    } while (((cVar12 == '\a') || (cVar12 == '\0')) &&
            (uVar16 = uVar16 + 1, uVar16 < *(uint *)(plVar3 + 1)));
  }
  if (in._4_4_ != 0) {
    if (uVar15 != 0) {
      uVar16 = 0;
      do {
        __s = *(void **)((long)&pfStack_68 + uVar16 * 8 + lVar8 + 0x68);
        uVar13 = (ulong)in._4_4_;
        *(undefined8 *)((long)&uStack_70 + lVar7) = 0x144369;
        memset(__s,0,uVar13 << 2);
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    if ((int)plVar3[1] != 0) {
      local_60 = plVar3 + 0xa8a;
      uVar16 = 0;
      do {
        puVar5 = *(undefined8 **)(*plVar3 + uVar16 * 8);
        if (puVar5 != (undefined8 *)0x0) {
          if (*(char *)(puVar5 + 0x1b) == '\x01') {
            *(undefined8 *)((long)&uStack_70 + lVar7) = 0x1443ae;
            calculate_volumes_resolver(puVar5,plVar3);
            *(undefined8 *)((long)&uStack_70 + lVar7) = 0x1443b9;
            calculate_pitch_shift_resolver(puVar5,plVar3);
            *(undefined1 *)(puVar5 + 0x1b) = 0;
          }
          pmVar4 = (mixed_buffer *)*puVar5;
          *(undefined8 *)((long)&uStack_70 + lVar7) = 0x1443d2;
          mixed_buffer_request_read(&local_40,(uint32_t *)((long)&in + 4),pmVar4);
          uVar11 = in._4_4_;
          pfVar10 = local_40;
          plVar9 = local_60;
          if ((*(float *)((long)puVar5 + 0xd4) != 1.0) || (NAN(*(float *)((long)puVar5 + 0xd4)))) {
            *(undefined8 *)((long)&uStack_70 + lVar7) = 0x144408;
            fft_window_resolver(pfVar10,pfVar10,uVar11,plVar9,fft_pitch_shift_resolver,
                                (long)puVar5 + 0xd4);
          }
          uVar11 = in._4_4_;
          bVar2 = *(byte *)((long)puVar5 + 0xd1);
          if ((ulong)bVar2 != 0) {
            uVar13 = 0;
            do {
              if ((ulong)in._4_4_ != 0) {
                lVar6 = *(long *)((long)&pfStack_68 +
                                 (ulong)*(byte *)((long)puVar5 + uVar13 + 0xb0) * 8 + lVar8 + 0x68);
                fVar1 = *(float *)((long)puVar5 + uVar13 * 4 + 0x2c);
                uVar14 = 0;
                do {
                  *(float *)(lVar6 + uVar14 * 4) =
                       local_44 * fVar1 * local_40[uVar14] + *(float *)(lVar6 + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while (in._4_4_ != uVar14);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != bVar2);
          }
          pmVar4 = (mixed_buffer *)*puVar5;
          *(undefined8 *)((long)&uStack_70 + lVar7) = 0x14446d;
          mixed_buffer_finish_read(uVar11,pmVar4);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < *(uint *)(plVar3 + 1));
    }
  }
  if (uVar15 != 0) {
    uVar16 = 0;
    do {
      size = in._4_4_;
      pmVar4 = *(mixed_buffer **)(plVar3[2] + uVar16 * 8);
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x144494;
      mixed_buffer_finish_write(size,pmVar4);
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  return 1;
}

Assistant:

VECTORIZE int space_mixer_mix(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  uint32_t samples = UINT32_MAX;
  uint32_t channels = data->channels.count;
  float *restrict outs[channels], *restrict in;
  float global_volume = data->volume;
  
  // Compute sample counts
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_request_write(&outs[c], &samples, data->out[c]);
  }
  for(uint32_t s=0; s<data->count; ++s){
    struct space_source *source = data->sources[s];
    if(!source) continue;

    mixed_buffer_request_read(&in, &samples, source->buffer);
    if(samples == 0) break;
  }

  if(0 < samples){
    for(mixed_channel_t c=0; c<channels; ++c){
      memset(outs[c], 0, samples*sizeof(float));
    }
    for(uint32_t s=0; s<data->count; ++s){
      struct space_source *source = data->sources[s];
      if(!source) continue;
      
      if(source->dirty){
        calculate_volumes(source, data);
        calculate_pitch_shift(source, data);
        source->dirty = 0;
      }

      mixed_buffer_request_read(&in, &samples, source->buffer);
      if(source->pitch != 1.0)
        fft_window(in, in, samples, &data->fft_window_data, fft_pitch_shift, &source->pitch);
      for(mixed_channel_t c=0; c<source->speaker_count; ++c){
        float *restrict out = outs[source->speakers[c]];
        float volume = global_volume*source->volumes[c];
        for(uint32_t i=0; i<samples; ++i){
          out[i] += volume * in[i];
        }
      }
      mixed_buffer_finish_read(samples, source->buffer);
    }
  }
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_finish_write(samples, data->out[c]);
  };
  return 1;
}